

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void fejer1_compute(int n,double *x,double *w)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER1_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  uVar7 = (ulong)(uint)n;
  if (n == 1) {
    *x = 0.0;
    *w = 2.0;
    return;
  }
  pvVar3 = operator_new__(uVar7 * 8);
  iVar2 = n * 2 + -1;
  uVar4 = 0;
  do {
    *(double *)((long)pvVar3 + uVar4 * 8) = ((double)iVar2 * 3.141592653589793) / (double)(n * 2);
    iVar2 = iVar2 + -2;
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  uVar4 = 0;
  do {
    dVar8 = cos(*(double *)((long)pvVar3 + uVar4 * 8));
    x[uVar4] = dVar8;
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  uVar4 = 0;
  do {
    w[uVar4] = 1.0;
    dVar8 = *(double *)((long)pvVar3 + uVar4 * 8);
    iVar2 = 1;
    iVar6 = 4;
    uVar5 = 2;
    dVar9 = 1.0;
    do {
      dVar10 = cos((double)uVar5 * dVar8);
      dVar9 = dVar9 - (dVar10 + dVar10) / (double)(iVar6 * iVar2 + -1);
      w[uVar4] = dVar9;
      iVar1 = (-(uint)((uint)n >> 1 == 0) - ((uint)n >> 1)) + iVar2;
      iVar2 = iVar2 + 1;
      iVar6 = iVar6 + 4;
      uVar5 = uVar5 + 2;
    } while (iVar1 != 0);
    uVar4 = uVar4 + 1;
  } while (uVar4 != uVar7);
  uVar4 = 0;
  do {
    w[uVar4] = (w[uVar4] + w[uVar4]) / (double)n;
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void fejer1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER1_COMPUTE computes a Fejer type 1 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER1_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( 2 * ( n - i ) + 1 ) * r8_pi
               / double( 2 * n     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;
    for ( j = 1; j <= ( n / 2 ); j++ )
    {
      w[i] = w[i] - 2.0
        * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n );
  }

  delete [] theta;

  return;
}